

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall
CVmImageLoader::CVmImageLoader(CVmImageLoader *this,CVmImageFile *fp,char *fname,long base_ofs)

{
  char *pcVar1;
  void *pvVar2;
  CVmHashTable *this_00;
  void *pvVar3;
  CVmHashFunc *hash_function;
  undefined8 in_RCX;
  undefined8 in_RSI;
  char *in_RDI;
  char path [4096];
  char fname_abs [4096];
  size_t i;
  undefined8 in_stack_ffffffffffffdf98;
  CVmImagePool *in_stack_ffffffffffffdfa0;
  int hash_table_size;
  size_t in_stack_ffffffffffffdfc8;
  char *in_stack_ffffffffffffdfd0;
  char *in_stack_ffffffffffffefd0;
  size_t in_stack_ffffffffffffefd8;
  char *in_stack_ffffffffffffefe0;
  ulong local_28;
  
  *(undefined8 *)in_RDI = in_RSI;
  pcVar1 = lib_copy_str((char *)in_stack_ffffffffffffdfa0);
  *(char **)(in_RDI + 8) = pcVar1;
  *(undefined8 *)(in_RDI + 0x18) = in_RCX;
  os_get_abs_filename(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8,in_stack_ffffffffffffefd0)
  ;
  os_get_path_name(in_stack_ffffffffffffdfd0,in_stack_ffffffffffffdfc8,in_RDI);
  pcVar1 = lib_copy_str((char *)in_stack_ffffffffffffdfa0);
  *(char **)(in_RDI + 0x10) = pcVar1;
  in_RDI[0x20] = '\0';
  in_RDI[0x21] = '\0';
  in_RDI[0x22] = '\0';
  in_RDI[0x23] = '\0';
  for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
    pvVar2 = operator_new(0x28);
    CVmImagePool::CVmImagePool(in_stack_ffffffffffffdfa0);
    *(void **)(in_RDI + local_28 * 8 + 0x40) = pvVar2;
  }
  in_RDI[0x90] = in_RDI[0x90] & 0xfe;
  in_RDI[0x90] = in_RDI[0x90] & 0xfd;
  in_RDI[0x90] = in_RDI[0x90] & 0xfb;
  in_RDI[0x90] = in_RDI[0x90] & 0xf7;
  in_RDI[0x60] = '\0';
  in_RDI[0x61] = '\0';
  in_RDI[0x62] = '\0';
  in_RDI[99] = '\0';
  in_RDI[100] = '\0';
  in_RDI[0x65] = '\0';
  in_RDI[0x66] = '\0';
  in_RDI[0x67] = '\0';
  in_RDI[0x68] = '\0';
  in_RDI[0x69] = '\0';
  in_RDI[0x6a] = '\0';
  in_RDI[0x6b] = '\0';
  in_RDI[0x6c] = '\0';
  in_RDI[0x6d] = '\0';
  in_RDI[0x6e] = '\0';
  in_RDI[0x6f] = '\0';
  in_RDI[0x70] = '\0';
  in_RDI[0x71] = '\0';
  in_RDI[0x72] = '\0';
  in_RDI[0x73] = '\0';
  in_RDI[0x74] = '\0';
  in_RDI[0x75] = '\0';
  in_RDI[0x76] = '\0';
  in_RDI[0x77] = '\0';
  pvVar2 = operator_new(0x20);
  this_00 = (CVmHashTable *)operator_new(8);
  this_00->table_ = (CVmHashEntry **)0x0;
  CVmHashFuncCS::CVmHashFuncCS((CVmHashFuncCS *)in_stack_ffffffffffffdfa0);
  CVmHashTable::CVmHashTable
            (this_00,(int)((ulong)pvVar2 >> 0x20),(CVmHashFunc *)in_stack_ffffffffffffdfa0,
             (int)((ulong)in_stack_ffffffffffffdf98 >> 0x20));
  *(void **)(in_RDI + 0x50) = pvVar2;
  pvVar3 = operator_new(0x20);
  hash_table_size = (int)((ulong)pvVar2 >> 0x20);
  hash_function = (CVmHashFunc *)operator_new(8);
  ((CVmHashFunc *)&hash_function->_vptr_CVmHashFunc)->_vptr_CVmHashFunc = (_func_int **)0x0;
  CVmHashFuncCS::CVmHashFuncCS((CVmHashFuncCS *)hash_function);
  CVmHashTable::CVmHashTable(this_00,hash_table_size,hash_function,(int)((ulong)pvVar3 >> 0x20));
  *(void **)(in_RDI + 0x58) = pvVar3;
  in_RDI[0x80] = '\0';
  in_RDI[0x81] = '\0';
  in_RDI[0x82] = '\0';
  in_RDI[0x83] = '\0';
  in_RDI[0x84] = '\0';
  in_RDI[0x85] = '\0';
  in_RDI[0x86] = '\0';
  in_RDI[0x87] = '\0';
  in_RDI[0x78] = '\0';
  in_RDI[0x79] = '\0';
  in_RDI[0x7a] = '\0';
  in_RDI[0x7b] = '\0';
  in_RDI[0x7c] = '\0';
  in_RDI[0x7d] = '\0';
  in_RDI[0x7e] = '\0';
  in_RDI[0x7f] = '\0';
  in_RDI[0x88] = '\0';
  in_RDI[0x89] = '\0';
  in_RDI[0x8a] = '\0';
  in_RDI[0x8b] = '\0';
  in_RDI[0x8c] = '\0';
  in_RDI[0x8d] = '\0';
  in_RDI[0x8e] = '\0';
  in_RDI[0x8f] = '\0';
  return;
}

Assistant:

CVmImageLoader::CVmImageLoader(CVmImageFile *fp, const char *fname,
                               long base_ofs)
{
    size_t i;
    char fname_abs[OSFNMAX], path[OSFNMAX];
    
    /* remember the underlying image file interface */
    fp_ = fp;

    /* remember the image filename and the base seek offset */
    fname_ = lib_copy_str(fname);
    base_seek_ofs_ = base_ofs;

    /* save the file's fully-qualified, absolute directory path */
    os_get_abs_filename(fname_abs, sizeof(fname_abs), fname);
    os_get_path_name(path, sizeof(path), fname_abs);
    path_ = lib_copy_str(path);

    /* we don't know the file version yet */
    ver_ = 0;

    /* allocate the pool tracking objects */
    for (i = 0 ; i < sizeof(pools_)/sizeof(pools_[0]) ; ++i)
        pools_[i] = new CVmImagePool();

    /* no metaclass dependency table loaded yet */
    loaded_meta_dep_ = FALSE;

    /* no function set dependency table loaded yet */
    loaded_funcset_dep_ = FALSE;

    /* no entrypoint loaded yet */
    loaded_entrypt_ = FALSE;

    /* no GSYM block yet */
    has_gsym_ = FALSE;

    /* no runtime symbols loaded yet */
    runtime_symtab_ = 0;
    runtime_macros_ = 0;

    /* there's no reflection LookupTable yet */
    reflection_symtab_ = VM_INVALID_OBJ;
    reflection_macros_ = VM_INVALID_OBJ;

    /* create the exported symbol hash table */
    exports_ = new CVmHashTable(64, new CVmHashFuncCS(), TRUE);

    /* create the synthesized exports hash table */
    synth_exports_ = new CVmHashTable(16, new CVmHashFuncCS(), TRUE);

    /* no static initializer pages yet */
    static_head_ = static_tail_ = 0;

    /* we don't have a static initializer code offset yet */
    static_cs_ofs_ = 0;
}